

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O3

int lj_cf_misc_memprof_start(lua_State *L)

{
  long lVar1;
  int iVar2;
  GCstr *pGVar3;
  int *piVar4;
  GCstr *__file;
  lj_memprof_options local_48;
  
  pGVar3 = lj_lib_optstr(L,1);
  __file = (GCstr *)"memprof.bin";
  if (pGVar3 != (GCstr *)0x0) {
    __file = pGVar3 + 1;
  }
  piVar4 = (int *)lj_mem_realloc(L,(void *)0x0,0,0x800010);
  local_48.buf = (uint8_t *)(piVar4 + 4);
  local_48.writer = buffer_writer_default;
  local_48.on_stop = on_stop_cb_default;
  local_48.len = 0x800000;
  *(ulong *)(piVar4 + 2) = (ulong)(L->glref).ptr32;
  local_48.ctx = piVar4;
  iVar2 = open64((char *)__file,0x241,0x1a4);
  *piVar4 = iVar2;
  if (iVar2 != -1) {
    iVar2 = lj_memprof_start(L,&local_48);
    if (iVar2 == 0) {
      iVar2 = 1;
      lua_pushboolean(L,1);
    }
    else {
      iVar2 = prof_error(L,iVar2,(char *)0x0);
    }
    return iVar2;
  }
  lVar1 = *(long *)(piVar4 + 2);
  *(int *)(lVar1 + 0x50) = *(int *)(lVar1 + 0x50) + -0x800010;
  *(long *)(lVar1 + 0x90) = *(long *)(lVar1 + 0x90) + 0x800010;
  (**(code **)(lVar1 + 0x40))(*(undefined8 *)(lVar1 + 0x48),piVar4,0x800010,0);
  iVar2 = luaL_fileresult(L,0,(char *)__file);
  return iVar2;
}

Assistant:

LJLIB_CF(misc_memprof_start)
{
#if !LJ_HASMEMPROF
  const char *err_details = err2msg(LJ_ERR_PROF_DETAILS_DISABLED);
  return prof_error(L, PROFILE_ERRUSE, err_details);
#else
  struct lj_memprof_options opt = {0};
  GCstr *s = lj_lib_optstr(L, 1);
  const char *fname = s ? strdata(s) : MEMPROF_DEFAULT_OUTPUT;
  struct profile_ctx *ctx;
  int memprof_status;

  /*
  ** FIXME: more elegant solution with ctx.
  ** Throws in case of OOM.
  */
  ctx = lj_mem_new(L, sizeof(*ctx));
  opt.ctx = ctx;
  opt.buf = ctx->buf;
  opt.writer = buffer_writer_default;
  opt.on_stop = on_stop_cb_default;
  opt.len = STREAM_BUFFER_SIZE;

  ctx->g = G(L);
  ctx->fd = open(fname, O_CREAT | O_WRONLY | O_TRUNC, 0644);

  if (ctx->fd == -1) {
    lj_mem_free(ctx->g, ctx, sizeof(*ctx));
    return prof_error(L, PROFILE_ERRIO, fname);
  }

  memprof_status = lj_memprof_start(L, &opt);
  if (LJ_UNLIKELY(memprof_status != PROFILE_SUCCESS))
    return prof_error(L, memprof_status, NULL);

  lua_pushboolean(L, 1);
  return 1;
#endif /* !LJ_HASMEMPROF */
}